

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<int,_ft::allocator<int>_>::push_front
          (deque<int,_ft::allocator<int>_> *this,value_type_conflict *val)

{
  size_type n;
  pointer piVar1;
  size_t in_RDX;
  value_type_conflict *val_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  if ((this->m_start).m_cur == (this->m_start).m_first) {
    if ((this->m_start).m_node == this->m_map) {
      realloc(this,val,in_RDX);
    }
    if ((this->m_start).m_node[-1] == (pointer)0x0) {
      n = chunk_size(this);
      piVar1 = allocator<int>::allocate((allocator<int> *)&this->field_0x70,n);
      (this->m_start).m_node[-1] = piVar1;
      this->m_chunks = this->m_chunks + 1;
    }
  }
  dequeIterator<int,_64UL>::operator--(&this->m_start);
  allocator<int>::construct((allocator<int> *)&this->field_0x70,(this->m_start).m_cur,val);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_front(value_type const & val) {
		if (this->m_start.m_cur == this->m_start.m_first) {
			if (this->m_start.m_node == this->m_map) {
				this->realloc();
			}
			if (*(this->m_start.m_node - 1) == NULL) {
				*(this->m_start.m_node - 1) = this->m_alloc.allocate(this->chunk_size());
				++this->m_chunks;
			}
		}
		--this->m_start;
		this->m_alloc.construct(this->m_start.m_cur, val);
		++this->m_size;
	}